

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.cpp
# Opt level: O0

unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> * __thiscall
xscript::parser::ast_node::replace_child(ast_node *this,type_t t)

{
  type_t t_00;
  size_type sVar1;
  reference pvVar2;
  pointer this_00;
  pointer this_01;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *this_02;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *t3;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *t2;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> t1;
  type_t t_local;
  ast_node *this_local;
  
  t1._M_t.
  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>.
  _M_t.
  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>._M_head_impl._4_4_ = t;
  sVar1 = std::
          vector<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
          ::size(&this->children);
  if (sVar1 == 0) {
    this_local = (ast_node *)
                 add_child(this,t1._M_t.
                                super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                _M_head_impl._4_4_);
  }
  else {
    pvVar2 = std::
             vector<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
             ::back(&this->children);
    std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
    unique_ptr((unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                *)&t2,pvVar2);
    std::
    vector<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
    ::pop_back(&this->children);
    this_local = (ast_node *)
                 add_child(this,t1._M_t.
                                super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                _M_head_impl._4_4_);
    this_00 = std::
              unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
              ::operator->((unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                            *)this_local);
    this_01 = std::
              unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
              ::operator->((unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                            *)&t2);
    t_00 = get_type(this_01);
    this_02 = add_child(this_00,t_00);
    std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
    operator=(this_02,(unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                       *)&t2);
    std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
    ~unique_ptr((unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                 *)&t2);
  }
  return (unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *)
         this_local;
}

Assistant:

std::unique_ptr<ast_node>& ast_node::replace_child(type_t t) {
    if (children.size() == 0) {
        return add_child(t);
    } else {
        std::unique_ptr<ast_node> t1 = std::move(children.back());
        children.pop_back();
        std::unique_ptr<ast_node>& t2 = add_child(t);
        std::unique_ptr<ast_node>& t3 = t2->add_child(t1->get_type());
        t3 = std::move(t1);
        return t2;
    }
}